

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint32_t helper_cls_h(target_ulong_conflict r1)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = extract32(r1,0,0x10);
  uVar2 = extract32(r1,0x10,0x10);
  uVar5 = (int)(uVar1 << 0x10) >> 1 ^ uVar1 << 0x10;
  uVar3 = 0x20;
  uVar4 = uVar3;
  if (uVar5 != 0) {
    uVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = uVar4 ^ 0x1f;
  }
  uVar5 = (int)(uVar2 << 0x10) >> 1 ^ uVar2 << 0x10;
  if (uVar5 != 0) {
    uVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x1f;
  }
  uVar5 = uVar4 - 1;
  if (0xe < uVar4 - 1) {
    uVar5 = 0xf;
  }
  uVar4 = uVar3 - 1;
  if (0xe < uVar3 - 1) {
    uVar4 = 0xf;
  }
  return uVar4 << 0x10 | uVar5;
}

Assistant:

uint32_t helper_cls_h(target_ulong r1)
{
    uint32_t ret_hw0 = extract32(r1, 0, 16);
    uint32_t ret_hw1 = extract32(r1, 16, 16);

    ret_hw0 = clrsb32(ret_hw0 << 16);
    ret_hw1 = clrsb32(ret_hw1 << 16);

    if (ret_hw0 > 15) {
        ret_hw0 = 15;
    }
    if (ret_hw1 > 15) {
        ret_hw1 = 15;
    }

    return ret_hw0 | (ret_hw1 << 16);
}